

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O2

OnDiskIterator * OnDiskIterator::load(OnDiskIterator *__return_storage_ptr__,DatabaseName *name)

{
  reference pvVar1;
  unsigned_long byte_offset;
  unsigned_long file_offset;
  unsigned_long total_files;
  unsigned_long last_read_time;
  allocator<char> local_321;
  json j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0 [32];
  DatabaseName datafile_name;
  ifstream in;
  
  DatabaseName::get_full_path_abi_cxx11_(&datafile_name.db_base,name);
  std::ifstream::ifstream(&in,datafile_name.db_base._M_pathname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path(&datafile_name.db_base);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&j,(nullptr_t)0x0);
  nlohmann::operator>>((istream *)&in,&j);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"byte_offset");
  byte_offset = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<unsigned_long,_unsigned_long,_0>(pvVar1);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"file_offset");
  file_offset = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<unsigned_long,_unsigned_long,_0>(pvVar1);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"total_files");
  total_files = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<unsigned_long,_unsigned_long,_0>(pvVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"iterator",&local_321);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"backing_storage");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_310,pvVar1);
  DatabaseName::derive(&datafile_name,(EVP_PKEY_CTX *)name,(uchar *)local_2f0,(size_t *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string(local_2f0);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"last_read_timestamp");
  last_read_time =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::get<unsigned_long,_unsigned_long,_0>(pvVar1);
  OnDiskIterator(__return_storage_ptr__,name,&datafile_name,total_files,byte_offset,file_offset,
                 last_read_time);
  DatabaseName::~DatabaseName(&datafile_name);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&j);
  std::ifstream::~ifstream(&in);
  return __return_storage_ptr__;
}

Assistant:

OnDiskIterator OnDiskIterator::load(const DatabaseName &name) {
    std::ifstream in(name.get_full_path(), std::ifstream::binary);
    json j;
    in >> j;

    uint64_t byte_offset = j["byte_offset"];
    uint64_t file_offset = j["file_offset"];
    uint64_t total_files = j["total_files"];
    auto datafile_name = name.derive("iterator", j["backing_storage"]);
    uint64_t last_read_timestamp = j["last_read_timestamp"];

    return OnDiskIterator(name, datafile_name, total_files, byte_offset,
                          file_offset, last_read_timestamp);
}